

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

void __thiscall QIconLoader::ensureInitialized(QIconLoader *this)

{
  bool bVar1;
  int line;
  QPlatformTheme *pQVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QLatin1StringView in_stack_ffffffffffffff70;
  QDebug in_stack_ffffffffffffff88;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((ulong)((totally_ordered_wrapper<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_*>
                 *)&in_RDI[1].d.d)->ptr & 0x100) == 0) &&
     (pQVar2 = QGuiApplicationPrivate::platformTheme(), pQVar2 != (QPlatformTheme *)0x0)) {
    *(char *)((long)&((totally_ordered_wrapper<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_*>
                       *)&in_RDI[1].d.d)->ptr + 1) = '\x01';
    systemThemeName();
    QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (QString *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    QString::~QString((QString *)0x29d04e);
    bVar1 = QString::isEmpty((QString *)0x29d05c);
    if (bVar1) {
      systemFallbackThemeName();
      QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (QString *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      QString::~QString((QString *)0x29d092);
    }
    qt_iconEngineFactoryLoader();
    QFactoryLoader::keyMap();
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_RDI,CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
    ;
    QString::QString((QString *)QVar3.m_size,in_stack_ffffffffffffff70);
    line = QMultiMap<int,_QString>::key
                     ((QMultiMap<int,_QString> *)in_RDI,
                      (QString *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      (int *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    QString::~QString((QString *)0x29d0fd);
    QMultiMap<int,_QString>::~QMultiMap((QMultiMap<int,_QString> *)0x29d107);
    if (line != -1) {
      *(undefined1 *)
       &((totally_ordered_wrapper<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_*>
          *)&in_RDI[1].d.d)->ptr = 1;
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcIconLoader();
    anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)CONCAT44(line,in_stack_ffffffffffffff40)
               ,(QLoggingCategory *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x29d16f);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)QVar3.m_size,(char *)in_RDI,line,
                 (char *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                 (char *)0x29d185);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)QVar3.m_data,(char *)in_stack_ffffffffffffff88.stream);
      QDebug::operator<<((QDebug *)QVar3.m_size,in_RDI);
      QDebug::operator<<((QDebug *)QVar3.m_data,(char *)in_stack_ffffffffffffff88.stream);
      QDebug::operator<<((QDebug *)CONCAT44(line,in_stack_ffffffffffffff40),
                         (bool)in_stack_ffffffffffffff3f);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffff88);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIconLoader::ensureInitialized()
{
    if (!m_initialized) {
        if (!QGuiApplicationPrivate::platformTheme())
            return; // it's too early: try again later (QTBUG-74252)
        m_initialized = true;
        m_systemTheme = systemThemeName();

        if (m_systemTheme.isEmpty())
            m_systemTheme = systemFallbackThemeName();
        if (qt_iconEngineFactoryLoader()->keyMap().key("svg"_L1, -1) != -1)
            m_supportsSvg = true;

        qCDebug(lcIconLoader) << "Initialized icon loader with system theme"
            << m_systemTheme << "and SVG support" << m_supportsSvg;
    }
}